

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcHieNew.c
# Opt level: O0

void Au_ManReorderModels(Au_Man_t *p,Au_Ntk_t *pRoot)

{
  int iVar1;
  int iVar2;
  uint uVar3;
  Au_Ntk_t *pAVar4;
  Vec_Int_t *p_00;
  Vec_Ptr_t *p_01;
  Vec_Int_t *p_02;
  Au_Obj_t *pAVar5;
  Au_Obj_t *pAVar6;
  Au_Ntk_t *p_03;
  int local_5c;
  int Entry;
  int j;
  int k;
  int i;
  Au_Obj_t *pFan;
  Au_Obj_t *pBox;
  Au_Ntk_t *pBoxModel;
  Au_Ntk_t *pNtk;
  Vec_Int_t *vTemp;
  Vec_Int_t *vOrder;
  Vec_Ptr_t *vNtksNew;
  Au_Ntk_t *pRoot_local;
  Au_Man_t *p_local;
  
  for (j = 1; iVar1 = Vec_PtrSize(&p->vNtks), j < iVar1; j = j + 1) {
    pAVar4 = Au_ManNtk(p,j);
    pAVar4->fMark = 0;
  }
  iVar1 = Au_ManNtkNum(p);
  p_00 = Vec_IntAlloc(iVar1 + 1);
  Vec_IntPush(p_00,0);
  Au_ManReorderModels_rec(pRoot,p_00);
  iVar1 = Vec_IntEntryLast(p_00);
  if (iVar1 != pRoot->Id) {
    __assert_fail("Vec_IntEntryLast(vOrder) == pRoot->Id",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                  ,0x1b7,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
  }
  Vec_IntPop(p_00);
  for (j = 1; iVar1 = Vec_PtrSize(&p->vNtks), j < iVar1; j = j + 1) {
    pAVar4 = Au_ManNtk(p,j);
    if (pAVar4->fMark == 0) {
      Vec_IntPush(p_00,pAVar4->Id);
    }
  }
  Vec_IntPush(p_00,pRoot->Id);
  iVar1 = Vec_IntSize(p_00);
  iVar2 = Au_ManNtkNum(p);
  if (iVar1 == iVar2 + 1) {
    p_00->nSize = p_00->nSize + -1;
    p_00->pArray = p_00->pArray + 1;
    Vec_IntReverseOrder(p_00);
    p_00->pArray = p_00->pArray + -1;
    p_00->nSize = p_00->nSize + 1;
    iVar1 = Au_ManNtkNum(p);
    p_01 = Vec_PtrAlloc(iVar1 + 1);
    for (j = 0; iVar1 = Vec_IntSize(p_00), j < iVar1; j = j + 1) {
      iVar1 = Vec_IntEntry(p_00,j);
      pAVar4 = Au_ManNtk(p,iVar1);
      Vec_PtrPush(p_01,pAVar4);
    }
    iVar1 = Vec_IntEntry(p_00,1);
    if (iVar1 != pRoot->Id) {
      __assert_fail("Vec_IntEntry(vOrder, 1) == pRoot->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                    ,0x1ca,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
    }
    p_02 = Vec_IntInvert(p_00,0);
    Vec_IntFree(p_00);
    iVar1 = Vec_IntEntry(p_02,1);
    if (iVar1 != pRoot->Id) {
      __assert_fail("Vec_IntEntry(vOrder, 1) == pRoot->Id",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                    ,0x1cd,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
    }
    for (j = 1; iVar1 = Vec_PtrSize(&p->vNtks), j < iVar1; j = j + 1) {
      pAVar4 = Au_ManNtk(p,j);
      iVar1 = Vec_IntEntry(p_02,pAVar4->Id);
      pAVar4->Id = iVar1;
      for (Entry = 0; iVar1 = Vec_IntSize(&pAVar4->vObjs), Entry < iVar1; Entry = Entry + 1) {
        pAVar6 = Au_NtkObjI(pAVar4,Entry);
        iVar1 = Au_ObjIsBox(pAVar6);
        if (iVar1 != 0) {
          uVar3 = Vec_IntEntry(p_02,(uint)*(undefined8 *)pAVar6 & 0x3fffffff);
          *(ulong *)pAVar6 = *(ulong *)pAVar6 & 0xffffffffc0000000 | (ulong)uVar3 & 0x3fffffff;
          if (((undefined1  [16])*pAVar6 & (undefined1  [16])0x3fffffff) == (undefined1  [16])0x0) {
            __assert_fail("pBox->Func > 0",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                          ,0x1d5,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
          }
          for (local_5c = 0; iVar1 = Au_BoxFanoutNum(pAVar6), local_5c < iVar1;
              local_5c = local_5c + 1) {
            pAVar5 = Au_BoxFanout(pAVar6,local_5c);
            *(ulong *)pAVar5 =
                 *(ulong *)pAVar5 & 0xffffffffc0000000 |
                 (ulong)((uint)*(undefined8 *)pAVar6 & 0x3fffffff);
          }
        }
      }
    }
    if ((p->vNtks).pArray != (void **)0x0) {
      free((p->vNtks).pArray);
      (p->vNtks).pArray = (void **)0x0;
    }
    (p->vNtks).pArray = p_01->pArray;
    p_01->pArray = (void **)0x0;
    Vec_PtrFree(p_01);
    j = 1;
    do {
      iVar1 = Vec_PtrSize(&p->vNtks);
      if (iVar1 <= j) {
        Vec_IntFree(p_02);
        return;
      }
      pAVar4 = Au_ManNtk(p,j);
      for (Entry = 0; iVar1 = Vec_IntSize(&pAVar4->vObjs), Entry < iVar1; Entry = Entry + 1) {
        pAVar6 = Au_NtkObjI(pAVar4,Entry);
        iVar1 = Au_ObjIsBox(pAVar6);
        if (((iVar1 != 0) && (p_03 = Au_ObjModel(pAVar6), p_03 != (Au_Ntk_t *)0x0)) &&
           (p_03 != pAVar4)) {
          if ((((undefined1  [16])*pAVar6 & (undefined1  [16])0x3fffffff) != (undefined1  [16])0x0)
             && (((uint)*(undefined8 *)pAVar6 & 0x3fffffff) < (uint)pAVar4->Id)) {
            __assert_fail("!pBox->Func || pBox->Func >= (unsigned)pNtk->Id",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                          ,0x1e6,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
          }
          iVar1 = Au_ObjFaninNum(pAVar6);
          iVar2 = Au_NtkPiNum(p_03);
          if (iVar1 != iVar2) {
            __assert_fail("Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                          ,0x1e7,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
          }
          iVar1 = Au_BoxFanoutNum(pAVar6);
          iVar2 = Au_NtkPoNum(p_03);
          if (iVar1 != iVar2) {
            __assert_fail("Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                          ,0x1e8,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
          }
        }
      }
      j = j + 1;
    } while( true );
  }
  __assert_fail("Vec_IntSize(vOrder) == Au_ManNtkNum(p)+1",
                "/workspace/llm4binary/github/license_all_cmakelists_25/antmicro[P]abc-lib/src/base/abc/abcHieNew.c"
                ,0x1be,"void Au_ManReorderModels(Au_Man_t *, Au_Ntk_t *)");
}

Assistant:

void Au_ManReorderModels( Au_Man_t * p, Au_Ntk_t * pRoot )
{
    Vec_Ptr_t * vNtksNew;
    Vec_Int_t * vOrder, * vTemp;
    Au_Ntk_t * pNtk, * pBoxModel;
    Au_Obj_t * pBox, * pFan;
    int i, k, j, Entry;
    Au_ManForEachNtk( p, pNtk, i )
        pNtk->fMark = 0;
    // collect networks in the DFS order
    vOrder = Vec_IntAlloc( Au_ManNtkNum(p)+1 );
    Vec_IntPush( vOrder, 0 );
    Au_ManReorderModels_rec( pRoot, vOrder );
    assert( Vec_IntEntryLast(vOrder) == pRoot->Id );
    // add unconnected ones
    Vec_IntPop( vOrder );
    Au_ManForEachNtk( p, pNtk, i )
        if ( pNtk->fMark == 0 )
            Vec_IntPush( vOrder, pNtk->Id );
    Vec_IntPush( vOrder, pRoot->Id );
    assert( Vec_IntSize(vOrder) == Au_ManNtkNum(p)+1 );
    // reverse order
    vOrder->nSize--;
    vOrder->pArray++;
    Vec_IntReverseOrder( vOrder ); 
    vOrder->pArray--;
    vOrder->nSize++;
    // compute new order
    vNtksNew = Vec_PtrAlloc( Au_ManNtkNum(p)+1 );
    Vec_IntForEachEntry( vOrder, Entry, i )
        Vec_PtrPush( vNtksNew, Au_ManNtk(p, Entry) );
    // invert order
    assert( Vec_IntEntry(vOrder, 1) == pRoot->Id );
    vOrder = Vec_IntInvert( vTemp = vOrder, 0 );
    Vec_IntFree( vTemp );
    assert( Vec_IntEntry(vOrder, 1) == pRoot->Id );
    // update model numbers
    Au_ManForEachNtk( p, pNtk, i )
    {
        pNtk->Id = Vec_IntEntry( vOrder, pNtk->Id );
        Au_NtkForEachBox( pNtk, pBox, k )
        {
            pBox->Func = Vec_IntEntry( vOrder, pBox->Func );
            assert( pBox->Func > 0 );
            Au_BoxForEachFanout( pBox, pFan, j )
                pFan->Func = pBox->Func;
        }
    }
    // update
    ABC_FREE( p->vNtks.pArray );
    p->vNtks.pArray = vNtksNew->pArray;
    vNtksNew->pArray = NULL;
    Vec_PtrFree( vNtksNew );
    // verify
    Au_ManForEachNtk( p, pNtk, i )
        Au_NtkForEachBox( pNtk, pBox, k )
        {
            pBoxModel = Au_ObjModel(pBox);
            if ( pBoxModel == NULL || pBoxModel == pNtk )
                continue;
            assert( !pBox->Func || pBox->Func >= (unsigned)pNtk->Id );
            assert( Au_ObjFaninNum(pBox) == Au_NtkPiNum(pBoxModel) );
            assert( Au_BoxFanoutNum(pBox) == Au_NtkPoNum(pBoxModel) );
        }
    Vec_IntFree( vOrder );
}